

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_x86_movImmediate32
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t value)

{
  undefined1 in_AL;
  undefined3 uStack_8;
  uint8_t instruction [7];
  
  uStack_8 = CONCAT12(199,CONCAT11(SYSBVM_X86_64_ARG0 < destination,in_AL) | 0x4800);
  _uStack_8 = CONCAT17((char)((uint)value >> 0x18),
                       CONCAT16((char)((uint)value >> 0x10),
                                CONCAT15((char)((uint)value >> 8),
                                         CONCAT14((char)value,CONCAT13((char)destination,uStack_8)))
                               )) & 0xffffffff07ffffff | 0xc0000000;
  sysbvm_bytecodeJit_addBytes(jit,7,(uint8_t *)((long)register0x00000020 + -7));
  return;
}

Assistant:

static void sysbvm_jit_x86_movImmediate32(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t value)
{
    uint8_t instruction[] = {
        sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
        0xC7,
        sysbvm_jit_x86_modRMRegister(destination, 0),
        value & 0xFF, (value >> 8) & 0xFF, (value >> 16) & 0xFF, (value >> 24) & 0xFF,
    };

    sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
}